

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
accept<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>>,mpl_::bool_<false>>
          (xpression_peeker<char> *this,
          simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>_>,_mpl_::bool_<false>_>
          *xpr)

{
  matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>_>
  *in_RSI;
  xpression_peeker<char> *in_RDI;
  
  if (*(int *)&in_RSI[1].
               super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
               .str_ == 0) {
    fail((xpression_peeker<char> *)0x15466c);
  }
  else {
    matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>_>
    ::peek<char>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

mpl::false_ accept(simple_repeat_matcher<Xpr, Greedy> const &xpr)
    {
        if(Greedy() && 1U == xpr.width_)
        {
            ++this->leading_simple_repeat_;
            xpr.leading_ = this->leading_simple_repeat();
        }
        0 != xpr.min_ ? xpr.xpr_.peek(*this) : this->fail(); // could be a union of xpr and next
        return mpl::false_();
    }